

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitset.hpp
# Opt level: O1

bool __thiscall
boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_check_invariants
          (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this)

{
  ulong uVar1;
  pointer puVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = this->m_num_bits;
  uVar3 = uVar1 & 0x3f;
  if (uVar3 != 0) {
    if ((uVar1 == 0) ||
       (puVar2 = (this->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
       puVar2 == (this->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start)) {
      __assert_fail("size() > 0 && num_blocks() > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                    ,0x71c,
                    "const Block &boost::dynamic_bitset<>::m_highest_block() const [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                   );
    }
    if (puVar2[-1] >> (sbyte)uVar3 != 0) {
      return false;
    }
  }
  puVar2 = (this->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (long)(this->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
  if ((ulong)((long)(this->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2) < uVar4) {
    return false;
  }
  return (long)uVar4 >> 3 == ((uVar1 >> 6) + 1) - (ulong)(uVar3 == 0);
}

Assistant:

inline typename dynamic_bitset<Block, Allocator>::size_type
dynamic_bitset<Block, Allocator>::size() const BOOST_NOEXCEPT
{
    return m_num_bits;
}